

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_cursor_prev_entry(unqlite_kv_cursor *pCursor)

{
  int local_14;
  int rc;
  unqlite_kv_cursor *pCursor_local;
  
  if (pCursor->pStore->pIo->pMethods->xPrev == (_func_int_unqlite_kv_cursor_ptr *)0x0) {
    local_14 = -0x11;
  }
  else {
    local_14 = (*pCursor->pStore->pIo->pMethods->xPrev)(pCursor);
  }
  return local_14;
}

Assistant:

int unqlite_kv_cursor_prev_entry(unqlite_kv_cursor *pCursor)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	/* Check if the requested method is implemented by the underlying storage engine */
	if( pCursor->pStore->pIo->pMethods->xPrev == 0 ){
		rc = UNQLITE_NOTIMPLEMENTED;
	}else{
		/* Seek to the previous entry */
		rc = pCursor->pStore->pIo->pMethods->xPrev(pCursor);
	}
	return rc;
}